

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

uint64_t VP8LHistogramEstimateBits(VP8LHistogram *p)

{
  int length;
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  
  length = (1 << ((byte)p->palette_code_bits_ & 0x1f)) + 0x118;
  if (p->palette_code_bits_ < 1) {
    length = 0x118;
  }
  uVar3 = PopulationCost(p->literal_,length,(uint32_t *)0x0,p->is_used_);
  uVar4 = PopulationCost(p->red_,0x100,(uint32_t *)0x0,p->is_used_ + 1);
  uVar5 = PopulationCost(p->blue_,0x100,(uint32_t *)0x0,p->is_used_ + 2);
  uVar6 = PopulationCost(p->alpha_,0x100,(uint32_t *)0x0,p->is_used_ + 3);
  uVar7 = PopulationCost(p->distance_,0x28,(uint32_t *)0x0,p->is_used_ + 4);
  uVar1 = (*VP8LExtraCost)(p->literal_ + 0x100,0x18);
  uVar2 = (*VP8LExtraCost)(p->distance_,0x28);
  return (ulong)(uVar2 + uVar1) * 0x800000 + uVar7 + uVar6 + uVar5 + uVar4 + uVar3;
}

Assistant:

uint64_t VP8LHistogramEstimateBits(VP8LHistogram* const p) {
  return PopulationCost(p->literal_,
                        VP8LHistogramNumCodes(p->palette_code_bits_), NULL,
                        &p->is_used_[0]) +
         PopulationCost(p->red_, NUM_LITERAL_CODES, NULL, &p->is_used_[1]) +
         PopulationCost(p->blue_, NUM_LITERAL_CODES, NULL, &p->is_used_[2]) +
         PopulationCost(p->alpha_, NUM_LITERAL_CODES, NULL, &p->is_used_[3]) +
         PopulationCost(p->distance_, NUM_DISTANCE_CODES, NULL,
                        &p->is_used_[4]) +
         ((uint64_t)(VP8LExtraCost(p->literal_ + NUM_LITERAL_CODES,
                                   NUM_LENGTH_CODES) +
                     VP8LExtraCost(p->distance_, NUM_DISTANCE_CODES))
          << LOG_2_PRECISION_BITS);
}